

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void LargeIntRegMultiply<unsigned_long,long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint64_t *a,int64_t b,uint64_t *pRet)

{
  bool bVar1;
  uint64_t *in_RDX;
  uint64_t in_RSI;
  uint64_t *in_RDI;
  
  if (((long)in_RSI < 0) && (*in_RDI != 0)) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  bVar1 = MultiplyUint64(*in_RDI,in_RSI,in_RDX);
  if (!bVar1) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::uint64_t& a, std::int64_t b, std::uint64_t* pRet ) SAFEINT_CPP_THROW
    {
        if( b < 0 && a != 0 )
            E::SafeIntOnOverflow();

#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        if( !MultiplyUint64( a, (std::uint64_t)b, pRet ) )
            E::SafeIntOnOverflow();
#else
        LargeIntRegMultiply< std::uint64_t, std::uint64_t >::template RegMultiplyThrow< E >( a, (std::uint64_t)b, pRet );
#endif
    }